

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseArithmeticExpression(Parser *this)

{
  function<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_()> *in_RSI;
  code *local_70 [2];
  code *local_60;
  code *local_58;
  function<bool_(const_Token_&)> local_50;
  _Bind<std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*(Parser_*))()>
  local_30;
  
  local_30._M_f = (offset_in_Parser_to_subr)parseAddExpression;
  local_30._8_8_ = 0;
  std::function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()>::
  function<std::_Bind<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>(Parser::*(Parser*))()>,void>
            ((function<std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>()> *)
             &local_50,&local_30);
  local_70[1] = (code *)0x0;
  local_70[0] = Token::isBinaryOperator;
  local_58 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_invoke;
  local_60 = std::_Function_handler<bool_(const_Token_&),_bool_(*)(const_Token_&)>::_M_manager;
  parseExpression(this,in_RSI,&local_50);
  std::_Function_base::~_Function_base((_Function_base *)local_70);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseArithmeticExpression()
{
  return parseExpression(std::bind(&Parser::parseAddExpression, this), Token::isBinaryOperator);
}